

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

void __thiscall LLVMBC::ICmpInst::ICmpInst(ICmpInst *this,Predicate pred_,Value *LHS,Value *RHS)

{
  pointer ptr;
  pointer ppVVar1;
  
  CmpInst::CmpInst(&this->super_CmpInst,ICmp,pred_,LHS,RHS);
  ppVVar1 = (pointer)::dxil_spv::allocate_in_thread(0x10);
  *ppVVar1 = LHS;
  ppVVar1[1] = RHS;
  ptr = (this->super_CmpInst).super_Instruction.operands.
        super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_start;
  (this->super_CmpInst).super_Instruction.operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppVVar1;
  (this->super_CmpInst).super_Instruction.operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVVar1 + 2;
  (this->super_CmpInst).super_Instruction.operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = ppVVar1 + 2;
  if (ptr != (pointer)0x0) {
    ::dxil_spv::free_in_thread(ptr);
    return;
  }
  return;
}

Assistant:

ICmpInst::ICmpInst(Predicate pred_, Value *LHS, Value *RHS)
    : CmpInst(ValueKind::ICmp, pred_, LHS, RHS)
{
	set_operands({ LHS, RHS });
}